

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::End(void)

{
  ImGuiLastItemData *pIVar1;
  float *pfVar2;
  ImRect *pIVar3;
  ImVec2 IVar4;
  int iVar5;
  ImGuiWindow_conflict *pIVar6;
  ImGuiWindow_conflict *pIVar7;
  ImGuiWindowStackData *pIVar8;
  ImVec2 IVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ImGuiID IVar14;
  ImGuiItemFlags IVar15;
  ImGuiContext_conflict1 *pIVar16;
  ImGuiItemStatusFlags IVar17;
  float fVar18;
  uint uVar19;
  long lVar20;
  char *__function;
  ImGuiWindow *window;
  
  pIVar16 = GImGui;
  pIVar6 = GImGui->CurrentWindow;
  iVar5 = (GImGui->CurrentWindowStack).Size;
  if (iVar5 < 2) {
    if (GImGui->WithinFrameScopeWithImplicitWindow == true) {
      __assert_fail("(g.CurrentWindowStack.Size > 1) && \"Calling End() too many times!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x1b28,"void ImGui::End()");
    }
    if (iVar5 != 1) {
      __assert_fail("g.CurrentWindowStack.Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x1b2b,"void ImGui::End()");
    }
  }
  uVar19 = pIVar6->Flags;
  if ((((uVar19 & 0x21000000) == 0x1000000) && ((pIVar6->field_0x3e1 & 1) == 0)) &&
     (GImGui->WithinEndChild == false)) {
    __assert_fail("(g.WithinEndChild) && \"Must call EndChild() and not End()!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x1b2f,"void ImGui::End()");
  }
  if ((pIVar6->DC).CurrentColumns != (ImGuiOldColumns *)0x0) {
    EndColumns();
    uVar19 = pIVar6->Flags;
  }
  if ((uVar19 >> 0x1d & 1) == 0) {
    PopClipRect();
    uVar19 = pIVar6->Flags;
  }
  if ((uVar19 >> 0x18 & 1) == 0) {
    LogFinish();
  }
  if (((pIVar6->DockNode != (ImGuiDockNode *)0x0) && ((pIVar6->field_0x3e1 & 4) != 0)) &&
     (pIVar7 = pIVar6->DockNode->HostWindow, pIVar7 != (ImGuiWindow_conflict *)0x0)) {
    IVar4 = (pIVar6->DC).CursorMaxPos;
    IVar9.y = (IVar4.y + (pIVar6->WindowPadding).y) - (pIVar7->WindowPadding).y;
    IVar9.x = (IVar4.x + (pIVar6->WindowPadding).x) - (pIVar7->WindowPadding).x;
    (pIVar7->DC).CursorMaxPos = IVar9;
  }
  lVar20 = (long)(pIVar16->CurrentWindowStack).Size;
  if (lVar20 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                  ,0x70f,"T &ImVector<ImGuiWindowStackData>::back() [T = ImGuiWindowStackData]");
  }
  pIVar8 = (pIVar16->CurrentWindowStack).Data;
  pIVar1 = &pIVar8[lVar20 + -1].ParentLastItemDataBackup;
  IVar14 = pIVar1->ID;
  IVar15 = pIVar1->InFlags;
  IVar17 = pIVar1->StatusFlags;
  fVar18 = (pIVar1->Rect).Min.x;
  pfVar2 = &pIVar8[lVar20 + -1].ParentLastItemDataBackup.Rect.Min.y;
  uVar10 = *(undefined8 *)pfVar2;
  uVar11 = *(undefined8 *)(pfVar2 + 2);
  pfVar2 = &pIVar8[lVar20 + -1].ParentLastItemDataBackup.NavRect.Min.y;
  uVar12 = *(undefined8 *)pfVar2;
  uVar13 = *(undefined8 *)(pfVar2 + 2);
  pIVar3 = &pIVar8[lVar20 + -1].ParentLastItemDataBackup.DisplayRect;
  IVar4 = pIVar3->Max;
  (pIVar16->LastItemData).DisplayRect.Min = pIVar3->Min;
  (pIVar16->LastItemData).DisplayRect.Max = IVar4;
  *(undefined8 *)&(pIVar16->LastItemData).NavRect.Min.y = uVar12;
  *(undefined8 *)&(pIVar16->LastItemData).NavRect.Max.y = uVar13;
  *(undefined8 *)&(pIVar16->LastItemData).Rect.Min.y = uVar10;
  *(undefined8 *)&(pIVar16->LastItemData).Rect.Max.y = uVar11;
  (pIVar16->LastItemData).ID = IVar14;
  (pIVar16->LastItemData).InFlags = IVar15;
  (pIVar16->LastItemData).StatusFlags = IVar17;
  (pIVar16->LastItemData).Rect.Min.x = fVar18;
  if ((pIVar6->Flags & 0x4000000) != 0) {
    iVar5 = (pIVar16->BeginPopupStack).Size;
    if (iVar5 < 1) {
      __function = "void ImVector<ImGuiPopupData>::pop_back() [T = ImGuiPopupData]";
      goto LAB_001cf100;
    }
    (pIVar16->BeginPopupStack).Size = iVar5 + -1;
  }
  ImGuiStackSizes::CompareWithCurrentState(&pIVar8[lVar20 + -1].StackSizesOnBegin);
  iVar5 = (pIVar16->CurrentWindowStack).Size;
  if (0 < iVar5) {
    uVar19 = iVar5 - 1;
    (pIVar16->CurrentWindowStack).Size = uVar19;
    if (uVar19 == 0) {
      window = (ImGuiWindow *)0x0;
    }
    else {
      window = (pIVar16->CurrentWindowStack).Data[(ulong)uVar19 - 1].Window;
    }
    SetCurrentWindow((ImGuiWindow_conflict *)window);
    if (pIVar16->CurrentWindow != (ImGuiWindow_conflict *)0x0) {
      SetCurrentViewport((ImGuiWindow_conflict *)window,pIVar16->CurrentWindow->Viewport);
      return;
    }
    return;
  }
  __function = "void ImVector<ImGuiWindowStackData>::pop_back() [T = ImGuiWindowStackData]";
LAB_001cf100:
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                ,0x71b,__function);
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if ((window->Flags & ImGuiWindowFlags_ChildWindow) && !(window->Flags & ImGuiWindowFlags_DockNodeHost) && !window->DockIsActive)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    if (!(window->Flags & ImGuiWindowFlags_DockNodeHost))   // Pop inner window clip rectangle
        PopClipRect();

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Docking: report contents sizes to parent to allow for auto-resize
    if (window->DockNode && window->DockTabIsVisible)
        if (ImGuiWindow* host_window = window->DockNode->HostWindow)         // FIXME-DOCK
            host_window->DC.CursorMaxPos = window->DC.CursorMaxPos + window->WindowPadding - host_window->WindowPadding;

    // Pop from window stack
    g.LastItemData = g.CurrentWindowStack.back().ParentLastItemDataBackup;
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    g.CurrentWindowStack.back().StackSizesOnBegin.CompareWithCurrentState();
    g.CurrentWindowStack.pop_back();
    SetCurrentWindow(g.CurrentWindowStack.Size == 0 ? NULL : g.CurrentWindowStack.back().Window);
    if (g.CurrentWindow)
        SetCurrentViewport(g.CurrentWindow, g.CurrentWindow->Viewport);
}